

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5ExprNode *
sqlite3Fts5ParseNode
          (Fts5Parse *pParse,int eType,Fts5ExprNode *pLeft,Fts5ExprNode *pRight,
          Fts5ExprNearset *pNear)

{
  Fts5ExprPhrase *pFVar1;
  char *pcVar2;
  Fts5ExprPhrase *pPhrase;
  int iPhrase;
  sqlite3_int64 nByte;
  Fts5ExprNode *pFStack_40;
  int nChild;
  Fts5ExprNode *pRet;
  Fts5ExprNearset *pNear_local;
  Fts5ExprNode *pRight_local;
  Fts5ExprNode *pLeft_local;
  int eType_local;
  Fts5Parse *pParse_local;
  
  pFStack_40 = (Fts5ExprNode *)0x0;
  if (pParse->rc == 0) {
    nByte._4_4_ = 0;
    if ((eType == 9) && (pNear == (Fts5ExprNearset *)0x0)) {
      return (Fts5ExprNode *)0x0;
    }
    if ((eType != 9) && (pLeft == (Fts5ExprNode *)0x0)) {
      return pRight;
    }
    if ((eType != 9) && (pRight == (Fts5ExprNode *)0x0)) {
      return pLeft;
    }
    if (eType == 3) {
      nByte._4_4_ = 2;
    }
    else if ((eType == 2) || (eType == 1)) {
      nByte._4_4_ = 2;
      if (pLeft->eType == eType) {
        nByte._4_4_ = pLeft->nChild + 1;
      }
      if (pRight->eType == eType) {
        nByte._4_4_ = pRight->nChild + -1 + nByte._4_4_;
      }
    }
    pFStack_40 = (Fts5ExprNode *)
                 sqlite3Fts5MallocZero(&pParse->rc,(long)(nByte._4_4_ + -1) * 8 + 0x38);
    if (pFStack_40 != (Fts5ExprNode *)0x0) {
      pFStack_40->eType = eType;
      pFStack_40->pNear = pNear;
      fts5ExprAssignXNext(pFStack_40);
      if (eType == 9) {
        for (pPhrase._4_4_ = 0; pPhrase._4_4_ < pNear->nPhrase; pPhrase._4_4_ = pPhrase._4_4_ + 1) {
          pNear->apPhrase[pPhrase._4_4_]->pNode = pFStack_40;
          if (pNear->apPhrase[pPhrase._4_4_]->nTerm == 0) {
            pFStack_40->xNext = (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0;
            pFStack_40->eType = 0;
          }
        }
        if ((pParse->pConfig->eDetail != 0) &&
           (((pFVar1 = pNear->apPhrase[0], pNear->nPhrase != 1 || (1 < pFVar1->nTerm)) ||
            ((0 < pFVar1->nTerm && (pFVar1->aTerm[0].bFirst != '\0')))))) {
          pParse->rc = 1;
          pcVar2 = "NEAR";
          if (pNear->nPhrase == 1) {
            pcVar2 = "phrase";
          }
          pcVar2 = sqlite3_mprintf("fts5: %s queries are not supported (detail!=full)",pcVar2);
          pParse->zErr = pcVar2;
          sqlite3_free(pFStack_40);
          pFStack_40 = (Fts5ExprNode *)0x0;
        }
      }
      else {
        fts5ExprAddChildren(pFStack_40,pLeft);
        fts5ExprAddChildren(pFStack_40,pRight);
      }
    }
  }
  if (pFStack_40 == (Fts5ExprNode *)0x0) {
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
    sqlite3Fts5ParseNearsetFree(pNear);
  }
  return pFStack_40;
}

Assistant:

static Fts5ExprNode *sqlite3Fts5ParseNode(
  Fts5Parse *pParse,              /* Parse context */
  int eType,                      /* FTS5_STRING, AND, OR or NOT */
  Fts5ExprNode *pLeft,            /* Left hand child expression */
  Fts5ExprNode *pRight,           /* Right hand child expression */
  Fts5ExprNearset *pNear          /* For STRING expressions, the near cluster */
){
  Fts5ExprNode *pRet = 0;

  if( pParse->rc==SQLITE_OK ){
    int nChild = 0;               /* Number of children of returned node */
    sqlite3_int64 nByte;          /* Bytes of space to allocate for this node */
 
    assert( (eType!=FTS5_STRING && !pNear)
         || (eType==FTS5_STRING && !pLeft && !pRight)
    );
    if( eType==FTS5_STRING && pNear==0 ) return 0;
    if( eType!=FTS5_STRING && pLeft==0 ) return pRight;
    if( eType!=FTS5_STRING && pRight==0 ) return pLeft;

    if( eType==FTS5_NOT ){
      nChild = 2;
    }else if( eType==FTS5_AND || eType==FTS5_OR ){
      nChild = 2;
      if( pLeft->eType==eType ) nChild += pLeft->nChild-1;
      if( pRight->eType==eType ) nChild += pRight->nChild-1;
    }

    nByte = sizeof(Fts5ExprNode) + sizeof(Fts5ExprNode*)*(nChild-1);
    pRet = (Fts5ExprNode*)sqlite3Fts5MallocZero(&pParse->rc, nByte);

    if( pRet ){
      pRet->eType = eType;
      pRet->pNear = pNear;
      fts5ExprAssignXNext(pRet);
      if( eType==FTS5_STRING ){
        int iPhrase;
        for(iPhrase=0; iPhrase<pNear->nPhrase; iPhrase++){
          pNear->apPhrase[iPhrase]->pNode = pRet;
          if( pNear->apPhrase[iPhrase]->nTerm==0 ){
            pRet->xNext = 0;
            pRet->eType = FTS5_EOF;
          }
        }

        if( pParse->pConfig->eDetail!=FTS5_DETAIL_FULL ){
          Fts5ExprPhrase *pPhrase = pNear->apPhrase[0];
          if( pNear->nPhrase!=1 
           || pPhrase->nTerm>1
           || (pPhrase->nTerm>0 && pPhrase->aTerm[0].bFirst)
          ){
            assert( pParse->rc==SQLITE_OK );
            pParse->rc = SQLITE_ERROR;
            assert( pParse->zErr==0 );
            pParse->zErr = sqlite3_mprintf(
                "fts5: %s queries are not supported (detail!=full)", 
                pNear->nPhrase==1 ? "phrase": "NEAR"
                );
            sqlite3_free(pRet);
            pRet = 0;
          }
        }
      }else{
        fts5ExprAddChildren(pRet, pLeft);
        fts5ExprAddChildren(pRet, pRight);
      }
    }
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
    sqlite3Fts5ParseNearsetFree(pNear);
  }
  return pRet;
}